

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O2

int __thiscall
ncnn::Layer::forward
          (Layer *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int *piVar1;
  long *plVar2;
  int iVar3;
  pointer pMVar4;
  long lVar5;
  void *in_R8;
  long lVar6;
  Mat local_78;
  
  if (this->support_inplace == true) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=(top_blobs,bottom_blobs);
    pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = -1;
    lVar6 = 0;
    do {
      lVar5 = lVar5 + 1;
      if ((int)(((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar4) / 0x48) <= lVar5) {
        iVar3 = (*this->_vptr_Layer[8])(this,top_blobs,opt);
        return iVar3;
      }
      Mat::clone(&local_78,
                 (__fn *)((long)&((bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_start)->data + lVar6),
                 opt->blob_allocator,0x48,in_R8);
      Mat::operator=((Mat *)((long)&((top_blobs->
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                     _M_impl.super__Vector_impl_data._M_start)->data + lVar6),
                     &local_78);
      Mat::~Mat(&local_78);
      pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while ((*(long *)((long)&pMVar4->data + lVar6) != 0) &&
            (piVar1 = (int *)((long)&pMVar4->c + lVar6),
            plVar2 = (long *)((long)&pMVar4->cstep + lVar6), lVar6 = lVar6 + 0x48,
            (long)*piVar1 * *plVar2 != 0));
    iVar3 = -100;
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int Layer::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    if (!support_inplace)
        return -1;

    top_blobs = bottom_blobs;
    for (int i = 0; i < (int)top_blobs.size(); i++)
    {
        top_blobs[i] = bottom_blobs[i].clone(opt.blob_allocator);
        if (top_blobs[i].empty())
            return -100;
    }

    return forward_inplace(top_blobs, opt);
}